

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int ret;
  Exception *this_00;
  double in_XMM0_Qa;
  
  ret = sqlite3_bind_double((this->mStmtPtr).mpStmt,__fd,in_XMM0_Qa);
  if (ret == 0) {
    return 0x264530;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(this->mStmtPtr).mpSQLite,ret);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Statement::bind(const int aIndex, const double aValue)
{
    const int ret = sqlite3_bind_double(mStmtPtr, aIndex, aValue);
    check(ret);
}